

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_MapTest_Test::ComparisonTest_MapTest_Test
          (ComparisonTest_MapTest_Test *this)

{
  ComparisonTest_MapTest_Test *this_local;
  
  ComparisonTest::ComparisonTest(&this->super_ComparisonTest);
  (this->super_ComparisonTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ComparisonTest_MapTest_Test_02a27220;
  return;
}

Assistant:

TEST_F(ComparisonTest, MapTest) {
  Map<std::string, std::string>& map1 =
      *map_proto1_.mutable_map_string_string();
  map1["key1"] = "1";
  map1["key2"] = "2";
  map1["key3"] = "3";
  Map<std::string, std::string>& map2 =
      *map_proto2_.mutable_map_string_string();
  map2["key3"] = "0";
  map2["key2"] = "2";
  map2["key1"] = "1";

  EXPECT_EQ("modified: map_string_string[key3]: \"3\" -> \"0\"\n",
            Run(map_proto1_, map_proto2_));
}